

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O0

void __thiscall
asio::detail::reactive_socket_service_base::
async_receive<asio::mutable_buffers_1,std::function<void(std::error_code_const&,unsigned_long)>,asio::any_io_executor>
          (reactive_socket_service_base *this,base_implementation_type *impl,
          mutable_buffers_1 *buffers,message_flags flags,
          function<void_(const_std::error_code_&,_unsigned_long)> *handler,any_io_executor *io_ex)

{
  bool bVar1;
  undefined4 uVar2;
  reactive_socket_recv_op<asio::mutable_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
  *prVar3;
  uint in_ECX;
  long in_RSI;
  cancellation_slot *in_RDI;
  undefined8 in_R9;
  undefined1 uVar4;
  ptr p;
  associated_cancellation_slot_t<std::function<void_(const_std::error_code_&,_unsigned_long)>_> slot
  ;
  bool is_continuation;
  function<void_(const_std::error_code_&,_unsigned_long)> *in_stack_ffffffffffffff18;
  function<void_(const_std::error_code_&,_unsigned_long)> *in_stack_ffffffffffffff20;
  mutable_buffers_1 *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  error_code *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  any_io_executor *in_stack_ffffffffffffff58;
  undefined5 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff65;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  reactor_op_cancellation *in_stack_ffffffffffffff68;
  cancellation_handler_base **in_stack_ffffffffffffff90;
  enable_if_t<is_same<typename_associated_immediate_executor<typename_reactive_socket_recv_op<mutable_buffers_1,_function<void_(const_error_code_&,_unsigned_long)>,_any_io_executor>::handler_type,_typename_reactive_socket_recv_op<mutable_buffers_1,_function<void_(const_error_code_&,_unsigned_long)>,_any_io_executor>::io_executor_type>::asio_associated_immediate_executor_is_unspecialised,_void>::value>
  *in_stack_ffffffffffffff98;
  cancellation_slot local_40;
  undefined1 local_31;
  message_flags mStack_2c;
  uint local_1c;
  long local_10;
  
  mStack_2c = (message_flags)((ulong)in_R9 >> 0x20);
  local_1c = in_ECX;
  local_10 = in_RSI;
  local_31 = asio_handler_cont_helpers::
             is_continuation<std::function<void(std::error_code_const&,unsigned_long)>>
                       ((function<void_(const_std::error_code_&,_unsigned_long)> *)0x7c46e0);
  local_40.handler_ =
       (cancellation_handler_base **)
       get_associated_cancellation_slot<std::function<void(std::error_code_const&,unsigned_long)>>
                 (in_stack_ffffffffffffff18);
  prVar3 = reactive_socket_recv_op<asio::mutable_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
           ::ptr::allocate(in_stack_ffffffffffffff20);
  reactive_socket_recv_op<asio::mutable_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
  ::reactive_socket_recv_op
            ((reactive_socket_recv_op<asio::mutable_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
              *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38,(socket_type)((ulong)in_stack_ffffffffffffff30 >> 0x20),
             (state_type)((ulong)in_stack_ffffffffffffff30 >> 0x18),in_stack_ffffffffffffff28,
             mStack_2c,
             (function<void_(const_std::error_code_&,_unsigned_long)> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_ffffffffffffff58
            );
  bVar1 = cancellation_slot::is_connected(&local_40);
  if (bVar1) {
    in_stack_ffffffffffffff90 = in_RDI->handler_;
    in_stack_ffffffffffffff68 =
         cancellation_slot::
         emplace<asio::detail::reactive_socket_service_base::reactor_op_cancellation,asio::detail::epoll_reactor*,asio::detail::epoll_reactor::descriptor_state**,int&,asio::detail::epoll_reactor::op_types>
                   (in_RDI,&in_stack_ffffffffffffff68->reactor_,
                    (descriptor_state ***)
                    CONCAT17(in_stack_ffffffffffffff67,
                             CONCAT16(in_stack_ffffffffffffff66,
                                      CONCAT15(in_stack_ffffffffffffff65,in_stack_ffffffffffffff60))
                            ),(int *)in_stack_ffffffffffffff58,
                    (op_types *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    (prVar3->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
    cancellation_key_ = in_stack_ffffffffffffff68;
  }
  uVar2 = 0;
  if ((local_1c & 1) != 0) {
    uVar2 = 2;
  }
  uVar4 = (local_1c & 1) == 0;
  bVar1 = false;
  uVar5 = local_31;
  if ((*(byte *)(local_10 + 4) & 0x10) != 0) {
    bVar1 = buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::all_empty
                      ((mutable_buffers_1 *)0x7c48aa);
  }
  start_op<asio::detail::reactive_socket_recv_op<asio::mutable_buffers_1,std::function<void(std::error_code_const&,unsigned_long)>,asio::any_io_executor>>
            ((reactive_socket_service_base *)in_stack_ffffffffffffff68,
             (base_implementation_type *)
             CONCAT17(bVar1,CONCAT16(uVar4,CONCAT15(uVar5,in_stack_ffffffffffffff60))),
             (int)((ulong)prVar3 >> 0x20),
             (reactive_socket_recv_op<asio::mutable_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
              *)CONCAT44(uVar2,in_stack_ffffffffffffff50),SUB81((ulong)local_10 >> 0x38,0),
             SUB81((ulong)local_10 >> 0x30,0),SUB81((ulong)local_10 >> 0x28,0),
             SUB81((ulong)local_10 >> 0x20,0),in_stack_ffffffffffffff90,in_stack_ffffffffffffff98);
  reactive_socket_recv_op<asio::mutable_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
  ::ptr::~ptr((ptr *)0x7c4941);
  return;
}

Assistant:

void async_receive(base_implementation_type& impl,
      const MutableBufferSequence& buffers, socket_base::message_flags flags,
      Handler& handler, const IoExecutor& io_ex)
  {
    bool is_continuation =
      asio_handler_cont_helpers::is_continuation(handler);

    associated_cancellation_slot_t<Handler> slot
      = asio::get_associated_cancellation_slot(handler);

    // Allocate and construct an operation to wrap the handler.
    typedef reactive_socket_recv_op<
        MutableBufferSequence, Handler, IoExecutor> op;
    typename op::ptr p = { asio::detail::addressof(handler),
      op::ptr::allocate(handler), 0 };
    p.p = new (p.v) op(success_ec_, impl.socket_,
        impl.state_, buffers, flags, handler, io_ex);

    // Optionally register for per-operation cancellation.
    if (slot.is_connected())
    {
      p.p->cancellation_key_ =
        &slot.template emplace<reactor_op_cancellation>(
            &reactor_, &impl.reactor_data_, impl.socket_, reactor::read_op);
    }

    ASIO_HANDLER_CREATION((reactor_.context(), *p.p, "socket",
          &impl, impl.socket_, "async_receive"));

    start_op(impl,
        (flags & socket_base::message_out_of_band)
          ? reactor::except_op : reactor::read_op,
        p.p, is_continuation,
        (flags & socket_base::message_out_of_band) == 0,
        ((impl.state_ & socket_ops::stream_oriented)
          && buffer_sequence_adapter<asio::mutable_buffer,
            MutableBufferSequence>::all_empty(buffers)), true, &io_ex, 0);
    p.v = p.p = 0;
  }